

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void clone_mobile(CHAR_DATA *parent,CHAR_DATA *clone)

{
  bool bVar1;
  char *pcVar2;
  CClass *this;
  char_data *in_RSI;
  long in_RDI;
  AFFECT_DATA *paf;
  int i;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  char_data *in_stack_ffffffffffffffe0;
  CHAR_DATA *ch;
  int local_14;
  char_data *pcVar3;
  
  if (((in_RDI != 0) && (in_RSI != (char_data *)0x0)) &&
     (bVar1 = is_npc(in_stack_ffffffffffffffd8), bVar1)) {
    pcVar2 = palloc_string((char *)paf);
    in_RSI->name = pcVar2;
    in_RSI->version = *(short *)(in_RDI + 0x100);
    pcVar2 = palloc_string((char *)paf);
    in_RSI->short_descr = pcVar2;
    pcVar2 = palloc_string((char *)paf);
    in_RSI->long_descr = pcVar2;
    pcVar2 = palloc_string((char *)paf);
    in_RSI->description = pcVar2;
    in_RSI->group = *(short *)(in_RDI + 0x130);
    in_RSI->sex = *(short *)(in_RDI + 0x134);
    pcVar3 = in_RSI;
    this = char_data::Class(in_RSI);
    CClass::GetIndex(this);
    char_data::SetClass(in_stack_ffffffffffffffe0,(int)((ulong)in_RSI >> 0x20));
    pcVar3->race = *(short *)(in_RDI + 0x136);
    pcVar3->level = *(short *)(in_RDI + 0x138);
    pcVar3->trust = 0;
    pcVar3->timer = *(short *)(in_RDI + 0x150);
    pcVar3->wait = *(short *)(in_RDI + 0x152);
    pcVar3->hit = *(int *)(in_RDI + 0x158);
    pcVar3->max_hit = *(short *)(in_RDI + 0x15c);
    pcVar3->mana = *(short *)(in_RDI + 0x15e);
    pcVar3->max_mana = *(short *)(in_RDI + 0x160);
    pcVar3->move = *(short *)(in_RDI + 0x162);
    pcVar3->max_move = *(short *)(in_RDI + 0x164);
    pcVar3->gold = *(long *)(in_RDI + 0x168);
    pcVar3->exp = *(int *)(in_RDI + 0x178);
    copy_vector(pcVar3->act,(long *)(in_RDI + 0x180));
    copy_vector(pcVar3->comm,(long *)(in_RDI + 400));
    copy_vector(pcVar3->imm_flags,(long *)(in_RDI + 0x1b0));
    copy_vector(pcVar3->res_flags,(long *)(in_RDI + 0x1c0));
    copy_vector(pcVar3->vuln_flags,(long *)(in_RDI + 0x1d0));
    pcVar3->invis_level = *(short *)(in_RDI + 0x1e0);
    copy_vector(pcVar3->affected_by,(long *)(in_RDI + 0x1e8));
    pcVar3->position = *(short *)(in_RDI + 0x1f8);
    pcVar3->practice = *(short *)(in_RDI + 0x1fa);
    pcVar3->train = *(short *)(in_RDI + 0x1fc);
    pcVar3->saving_throw = *(short *)(in_RDI + 0x202);
    pcVar3->alignment = *(short *)(in_RDI + 0x204);
    pcVar3->hitroll = *(short *)(in_RDI + 0x206);
    pcVar3->damroll = *(short *)(in_RDI + 0x208);
    pcVar3->wimpy = *(short *)(in_RDI + 0x212);
    copy_vector(pcVar3->form,(long *)(in_RDI + 0x280));
    copy_vector(pcVar3->parts,(long *)(in_RDI + 0x290));
    pcVar3->size = *(short *)(in_RDI + 0x2a0);
    copy_vector(pcVar3->off_flags,(long *)(in_RDI + 0x2c0));
    pcVar3->dam_type = *(short *)(in_RDI + 0x2d6);
    pcVar3->start_pos = *(short *)(in_RDI + 0x2d8);
    pcVar3->dam_mod = *(float *)(in_RDI + 0x2fc);
    pcVar3->defense_mod = *(short *)(in_RDI + 0x300);
    pcVar3->cabal = *(short *)(in_RDI + 0x132);
    pcVar3->arms = *(short *)(in_RDI + 0x304);
    pcVar3->legs = *(short *)(in_RDI + 0x306);
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      pcVar3->armor[local_14] = *(short *)(in_RDI + 0x20a + (long)local_14 * 2);
    }
    for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
      pcVar3->perm_stat[local_14] = *(short *)(in_RDI + 0x268 + (long)local_14 * 2);
      pcVar3->mod_stat[local_14] = *(short *)(in_RDI + 0x272 + (long)local_14 * 2);
    }
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      pcVar3->damage[local_14] = *(short *)(in_RDI + 0x2d0 + (long)local_14 * 2);
    }
    for (ch = *(CHAR_DATA **)(in_RDI + 0x88); ch != (CHAR_DATA *)0x0; ch = ch->next) {
      affect_to_char(ch,(AFFECT_DATA *)in_RSI);
    }
  }
  return;
}

Assistant:

void clone_mobile(CHAR_DATA *parent, CHAR_DATA *clone)
{
	int i;
	AFFECT_DATA *paf;

	if (parent == nullptr || clone == nullptr || !is_npc(parent))
		return;

	/* start fixing values */
	clone->name = palloc_string(parent->name);
	clone->version = parent->version;
	clone->short_descr = palloc_string(parent->short_descr);
	clone->long_descr = palloc_string(parent->long_descr);
	clone->description = palloc_string(parent->description);
	clone->group = parent->group;
	clone->sex = parent->sex;
	clone->SetClass(parent->Class()->GetIndex());
	clone->race = parent->race;
	clone->level = parent->level;
	clone->trust = 0;
	clone->timer = parent->timer;
	clone->wait = parent->wait;
	clone->hit = parent->hit;
	clone->max_hit = parent->max_hit;
	clone->mana = parent->mana;
	clone->max_mana = parent->max_mana;
	clone->move = parent->move;
	clone->max_move = parent->max_move;
	clone->gold = parent->gold;
	clone->exp = parent->exp;

	copy_vector(clone->act, parent->act);
	copy_vector(clone->comm, parent->comm);
	copy_vector(clone->imm_flags, parent->imm_flags);
	copy_vector(clone->res_flags, parent->res_flags);
	copy_vector(clone->vuln_flags, parent->vuln_flags);

	clone->invis_level = parent->invis_level;

	copy_vector(clone->affected_by, parent->affected_by);

	clone->position = parent->position;
	clone->practice = parent->practice;
	clone->train = parent->train;
	clone->saving_throw = parent->saving_throw;
	clone->alignment = parent->alignment;
	clone->hitroll = parent->hitroll;
	clone->damroll = parent->damroll;
	clone->wimpy = parent->wimpy;

	copy_vector(clone->form, parent->form);
	copy_vector(clone->parts, parent->parts);

	clone->size = parent->size;

	copy_vector(clone->off_flags, parent->off_flags);

	clone->dam_type = parent->dam_type;
	clone->start_pos = parent->start_pos;
	clone->dam_mod = parent->dam_mod;
	clone->defense_mod = parent->defense_mod;
	clone->cabal = parent->cabal;
	clone->arms = parent->arms;
	clone->legs = parent->legs;

	for (i = 0; i < 4; i++)
	{
		clone->armor[i] = parent->armor[i];
	}

	for (i = 0; i < MAX_STATS; i++)
	{
		clone->perm_stat[i] = parent->perm_stat[i];
		clone->mod_stat[i] = parent->mod_stat[i];
	}

	for (i = 0; i < 3; i++)
	{
		clone->damage[i] = parent->damage[i];
	}

	/* now add the affects */
	for (paf = parent->affected; paf != nullptr; paf = paf->next)
	{
		affect_to_char(clone, paf);
	}
}